

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool gl4cts::SparseTextureUtils::verifyQueryError
               (stringstream *log,char *funcName,GLint target,GLint pname,GLint error,
               GLint expectedError)

{
  size_t sVar1;
  ostream *poVar2;
  stringstream *this;
  
  if (error != expectedError) {
    this = log + 0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"QueryError [",0xc);
    if (funcName == (char *)0x0) {
      std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
    }
    else {
      sVar1 = strlen(funcName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,funcName,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this," return wrong error code",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", target: ",10);
    poVar2 = (ostream *)std::ostream::operator<<(this,target);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", pname: ",9);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pname);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", expected: ",0xc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,expectedError);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", returned: ",0xc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,error);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] - ",4);
  }
  return error == expectedError;
}

Assistant:

bool SparseTextureUtils::verifyQueryError(std::stringstream& log, const char* funcName, GLint target, GLint pname,
										  GLint error, GLint expectedError)
{
	if (error != expectedError)
	{
		log << "QueryError [" << funcName << " return wrong error code"
			<< ", target: " << target << ", pname: " << pname << ", expected: " << expectedError
			<< ", returned: " << error << "] - ";

		return false;
	}

	return true;
}